

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall soul::StructuralParser::parseUnary(StructuralParser *this)

{
  bool bVar1;
  Expression *pEVar2;
  TokenType token;
  UnaryOperator *pUVar3;
  Op type;
  Context context;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x274459);
  if (bVar1) {
    bVar1 = true;
  }
  else {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x296b6b);
    if (!bVar1) {
      bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType>
                        ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          *)this,(TokenType)0x296b6c,(TokenType)0x27590b,(TokenType)0x275daa);
      if (bVar1) {
        getContext(&context,this);
        token = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::skip(&this->super_SOULTokeniser);
        type = getUnaryOpForToken(token);
        pEVar2 = parseUnary(this);
        pUVar3 = allocate<soul::AST::UnaryOperator,soul::AST::Context&,soul::AST::Expression&,soul::UnaryOp::Op&>
                           (this,&context,pEVar2,&type);
        RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                  ((RefCountedPtr<soul::SourceCodeText> *)&context);
        return &pUVar3->super_Expression;
      }
      pEVar2 = parseFactor(this);
      return pEVar2;
    }
    bVar1 = false;
  }
  pEVar2 = parsePreIncDec(this,bVar1);
  return pEVar2;
}

Assistant:

AST::Expression& parseUnary()
    {
        if (matchIf (Operator::plusplus))    return parsePreIncDec (true);
        if (matchIf (Operator::minusminus))  return parsePreIncDec (false);

        if (matchesAny (Operator::minus, Operator::logicalNot, Operator::bitwiseNot))
        {
            auto context = getContext();
            auto type = getUnaryOpForToken (skip());
            return allocate<AST::UnaryOperator> (context, parseUnary(), type);
        }

        return parseFactor();
    }